

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdLib.cpp
# Opt level: O0

bool NULLC::IsDerivedFrom(NULLCRef derived,uint base)

{
  ExternTypeInfo *pEVar1;
  char *pcVar2;
  uint local_14;
  uint typeId;
  uint base_local;
  
  pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                     ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),base);
  if ((pEVar1->typeFlags & 4) == 0) {
    pcVar2 = nullcGetTypeName(base);
    nullcThrowError("ERROR: type \'%s\' is not extendable",pcVar2);
  }
  local_14 = derived.typeID;
  while( true ) {
    if (base == local_14) {
      return true;
    }
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),local_14);
    if (pEVar1->baseType == 0) break;
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),local_14);
    local_14 = pEVar1->baseType;
  }
  return false;
}

Assistant:

bool NULLC::IsDerivedFrom(NULLCRef derived, unsigned base)
{
	if((linker->exTypes[base].typeFlags & ExternTypeInfo::TYPE_IS_EXTENDABLE) == 0)
		nullcThrowError("ERROR: type '%s' is not extendable", nullcGetTypeName(base));

	unsigned typeId = derived.typeID;

	for(;;)
	{
		if(base == typeId)
			return true;

		if(linker->exTypes[typeId].baseType)
		{
			typeId = linker->exTypes[typeId].baseType;
		}
		else
		{
			break;
		}
	}

	return false;
}